

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalInterfaceExamples.cpp
# Opt level: O0

void writeGZ2(char *fileName,half *gPixels,float *zPixels,int width,int height,Box2i *dataWindow)

{
  int iVar1;
  char *pcVar2;
  int in_ECX;
  char *in_RDX;
  char *in_RSI;
  char *in_RDI;
  undefined4 in_R8D;
  FrameBuffer frameBuffer;
  OutputFile file;
  Header header;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  Slice local_148 [56];
  Slice local_110 [56];
  char local_d8 [48];
  undefined1 local_a8 [36];
  Channel local_84 [28];
  Vec2<float> local_68;
  Header local_60 [68];
  int local_1c;
  char *local_18;
  char *local_10;
  char *local_8;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  Imath_3_2::Vec2<float>::Vec2(&local_68,0.0,0.0);
  Imf_3_2::Header::Header((Header *)0x3f800000,local_60,in_ECX,in_R8D,&local_68,0,3);
  Imf_3_2::Header::dataWindow();
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator=
            ((Box<Imath_3_2::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
             (Box<Imath_3_2::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  pcVar2 = (char *)Imf_3_2::Header::channels();
  Imf_3_2::Channel::Channel(local_84,HALF,1,1,false);
  Imf_3_2::ChannelList::insert(pcVar2,(Channel *)"G");
  pcVar2 = (char *)Imf_3_2::Header::channels();
  Imf_3_2::Channel::Channel((Channel *)(local_a8 + 0x14),FLOAT,1,1,false);
  Imf_3_2::ChannelList::insert(pcVar2,(Channel *)"Z");
  iVar1 = Imf_3_2::globalThreadCount();
  Imf_3_2::OutputFile::OutputFile((OutputFile *)local_a8,local_8,local_60,iVar1);
  Imf_3_2::FrameBuffer::FrameBuffer((FrameBuffer *)0x1089b0);
  Imf_3_2::Slice::Slice(local_110,HALF,local_10,2,(long)local_1c * 2,1,1,0.0,false,false);
  Imf_3_2::FrameBuffer::insert(local_d8,(Slice *)"G");
  Imf_3_2::Slice::Slice(local_148,FLOAT,local_18,4,(long)local_1c << 2,1,1,0.0,false,false);
  Imf_3_2::FrameBuffer::insert(local_d8,(Slice *)"Z");
  Imf_3_2::OutputFile::setFrameBuffer((FrameBuffer *)local_a8);
  Imf_3_2::OutputFile::writePixels((int)local_a8);
  Imf_3_2::FrameBuffer::~FrameBuffer((FrameBuffer *)0x108ac2);
  Imf_3_2::OutputFile::~OutputFile((OutputFile *)local_a8);
  Imf_3_2::Header::~Header(local_60);
  return;
}

Assistant:

void
writeGZ2 (
    const char   fileName[],
    const half*  gPixels,
    const float* zPixels,
    int          width,
    int          height,
    const Box2i& dataWindow)
{
    //
    // Write an image with only a G (green) and a Z (depth) channel,
    // using class OutputFile.  Don't store the whole image in the
    // file, but crop it according to the given data window.
    //
    //	- create a file header
    //	- set the header's data window
    //	- add G and Z channels to the header
    //	- open the file, and store the header in the file
    //	- describe the memory layout of the G anx Z pixels
    //	- store the pixels in the file
    //

    Header header (width, height);
    header.dataWindow () = dataWindow;
    header.channels ().insert ("G", Channel (IMF::HALF));
    header.channels ().insert ("Z", Channel (IMF::FLOAT));

    OutputFile file (fileName, header);

    FrameBuffer frameBuffer;

    frameBuffer.insert (
        "G", // name
        Slice (
            IMF::HALF,                   // type
            (char*) gPixels,             // base
            sizeof (*gPixels) * 1,       // xStride
            sizeof (*gPixels) * width)); // yStride

    frameBuffer.insert (
        "Z", // name
        Slice (
            IMF::FLOAT,                  // type
            (char*) zPixels,             // base
            sizeof (*zPixels) * 1,       // xStride
            sizeof (*zPixels) * width)); // yStride

    file.setFrameBuffer (frameBuffer);
    file.writePixels (dataWindow.max.y - dataWindow.min.y + 1);
}